

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1512.c
# Opt level: O3

int test(char *URL)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  undefined8 uVar6;
  long *plVar7;
  undefined8 uVar8;
  bool bVar9;
  long lVar10;
  undefined8 uVar11;
  CURL *curl [2];
  char target_url [256];
  char dnsentry [256];
  long local_248 [2];
  undefined1 local_238 [255];
  undefined1 local_139;
  undefined1 local_138 [264];
  
  pcVar2 = libtest_arg3;
  pcVar1 = libtest_arg2;
  local_248[0] = 0;
  local_248[1] = 0;
  iVar3 = curl_global_init(3);
  if (iVar3 != 0) {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    return 0x7e;
  }
  curl_msnprintf(local_138,0x100,"server.example.curl:%s:%s",pcVar2,pcVar1);
  curl_mprintf("%s\n",local_138);
  uVar4 = curl_slist_append(0,local_138);
  lVar10 = 0;
  do {
    if (lVar10 == 2) {
      iVar3 = curl_easy_setopt(local_248[0],0x27db,uVar4);
      uVar11 = _stderr;
      if (iVar3 != 0) {
        uVar6 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar11,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1512.c"
                      ,0x4c,iVar3,uVar6);
        goto LAB_001024e6;
      }
      bVar9 = true;
      plVar7 = local_248;
      goto LAB_00102527;
    }
    lVar5 = curl_easy_init();
    local_248[lVar10] = lVar5;
    if (lVar5 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1512.c"
                    ,0x3c);
      iVar3 = 0x7c;
      goto LAB_001024e6;
    }
    curl_msnprintf(local_238,0x100,"http://server.example.curl:%s/path/1512%04i",pcVar2,
                   (int)lVar10 + 1);
    local_139 = 0;
    iVar3 = curl_easy_setopt(lVar5,0x2712,local_238);
    uVar11 = _stderr;
    if (iVar3 != 0) {
      uVar6 = curl_easy_strerror(iVar3);
      uVar8 = 0x42;
      goto LAB_001024d4;
    }
    iVar3 = curl_easy_setopt(lVar5,0x29,1);
    uVar11 = _stderr;
    if (iVar3 != 0) {
      uVar6 = curl_easy_strerror(iVar3);
      uVar8 = 0x44;
      goto LAB_001024d4;
    }
    iVar3 = curl_easy_setopt(lVar5,0x2a,1);
    uVar11 = _stderr;
    if (iVar3 != 0) {
      uVar6 = curl_easy_strerror(iVar3);
      uVar8 = 0x46;
      goto LAB_001024d4;
    }
    iVar3 = curl_easy_setopt(lVar5,0x5b,1);
    uVar11 = _stderr;
    lVar10 = lVar10 + 1;
  } while (iVar3 == 0);
  uVar6 = curl_easy_strerror(iVar3);
  uVar8 = 0x48;
LAB_001024d4:
  curl_mfprintf(uVar11,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1512.c"
                ,uVar8,iVar3,uVar6);
  goto LAB_001024e6;
  while (bVar9 = false, plVar7 = local_248 + 1, iVar3 == 0) {
LAB_00102527:
    iVar3 = curl_easy_perform(*plVar7);
    if (!bVar9) break;
  }
LAB_001024e6:
  curl_easy_cleanup(local_248[0]);
  curl_easy_cleanup(local_248[1]);
  curl_slist_free_all(uVar4);
  curl_global_cleanup();
  return iVar3;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl[NUM_HANDLES] = {NULL, NULL};
  char *port = libtest_arg3;
  char *address = libtest_arg2;
  char dnsentry[256];
  struct curl_slist *slist = NULL;
  int i;
  char target_url[256];
  (void)URL; /* URL is setup in the code */

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  msnprintf(dnsentry, sizeof(dnsentry), "server.example.curl:%s:%s",
            port, address);
  printf("%s\n", dnsentry);
  slist = curl_slist_append(slist, dnsentry);

  /* get NUM_HANDLES easy handles */
  for(i = 0; i < NUM_HANDLES; i++) {
    /* get an easy handle */
    easy_init(curl[i]);
    /* specify target */
    msnprintf(target_url, sizeof(target_url),
              "http://server.example.curl:%s/path/1512%04i",
              port, i + 1);
    target_url[sizeof(target_url) - 1] = '\0';
    easy_setopt(curl[i], CURLOPT_URL, target_url);
    /* go verbose */
    easy_setopt(curl[i], CURLOPT_VERBOSE, 1L);
    /* include headers */
    easy_setopt(curl[i], CURLOPT_HEADER, 1L);

    easy_setopt(curl[i], CURLOPT_DNS_USE_GLOBAL_CACHE, 1L);
  }

  /* make the first one populate the GLOBAL cache */
  easy_setopt(curl[0], CURLOPT_RESOLVE, slist);

  /* run NUM_HANDLES transfers */
  for(i = 0; (i < NUM_HANDLES) && !res; i++)
    res = curl_easy_perform(curl[i]);

test_cleanup:

  curl_easy_cleanup(curl[0]);
  curl_easy_cleanup(curl[1]);
  curl_slist_free_all(slist);
  curl_global_cleanup();

  return res;
}